

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitRefIsNull(InfoCollector *this,RefIsNull *curr)

{
  PossibleContents local_38;
  RefIsNull *local_18;
  RefIsNull *curr_local;
  InfoCollector *this_local;
  
  local_18 = curr;
  curr_local = (RefIsNull *)this;
  PossibleContents::many();
  addRoot(this,(Expression *)curr,&local_38);
  PossibleContents::~PossibleContents(&local_38);
  return;
}

Assistant:

void visitRefIsNull(RefIsNull* curr) {
    // TODO: Optimize when possible. For example, if we can infer an exact type
    //       here which allows us to know the result then we should do so. This
    //       is unlike the case in visitUnary, above: the information that lets
    //       us optimize *cannot* be written into Binaryen IR (unlike a Literal)
    //       so using it during this pass allows us to optimize new things.
    addRoot(curr);
  }